

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uras.c
# Opt level: O2

float dyy(qnode_ptr_t q,int x,int y,int z)

{
  param512_t *papVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  float *pfVar5;
  kernel_t *pkVar6;
  int iVar7;
  float fVar8;
  
  iVar2 = C.m / 2;
  iVar7 = iVar2 * 2 + q->ofst;
  lVar4 = (long)(q->res * x + y);
  papVar1 = q->param_ptr[z];
  piVar3 = &(*papVar1)[lVar4].err;
  if ((((iVar7 <= y) && (iVar7 <= x)) && (x < q->sizy - iVar7)) && (y < q->sizx - iVar7)) {
    *piVar3 = 0;
    pfVar5 = (float *)((long)papVar1 + lVar4 * 0x30 + (long)iVar2 * -0x30 + 0x1c);
    fVar8 = 0.0;
    pkVar6 = &C;
    for (lVar4 = (long)-iVar2; lVar4 <= iVar2; lVar4 = lVar4 + 1) {
      fVar8 = fVar8 + *pfVar5 * pkVar6->k[0];
      pfVar5 = pfVar5 + 0xc;
      pkVar6 = (kernel_t *)(pkVar6->k + 1);
    }
    return fVar8 / C.f;
  }
  *piVar3 = 1;
  return 0.0;
}

Assistant:

float dyy(q,x,y,z)
qnode_ptr_t q ;
int x, y, z ;

{ extern kernel_t C ;
  float d ;
  int i, h ;

  h = C.m/2 ;
  d = 0.0 ;

  if (overflow(x,y,q->sizy,q->sizx,q->ofst,h,2)) {
    (*q->param_ptr[z])[q->res*x + y].err = SA_OVERFLOW ;
  }
  else {
    (*q->param_ptr[z])[q->res*x + y].err = NO_ERROR ;
    for (i = -h ; i <= h ; i++) {
      d += (*q->param_ptr[z])[q->res*x + y+i].fy*C.k[i+h] ;
    }
    d /= C.f ;
  }
  return(d) ;
}